

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O3

bool __thiscall
burst::subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
::equal(subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
        *this,subsequence_iterator<const_char_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              *that)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  
  if (this->m_begin != that->m_begin) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                  ,0x83,
                  "bool burst::subsequence_iterator<const char *>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = const char *, SubsequenceContainer = std::vector<const char *>]"
                 );
  }
  if (this->m_end == that->m_end) {
    lVar1 = this->m_subsequence_size;
    if (lVar1 == that->m_subsequence_size) {
      if (lVar1 == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp((this->m_subsequence).
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (that->m_subsequence).
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start,lVar1 << 3);
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  __assert_fail("this->m_end == that.m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subsequence_iterator.hpp"
                ,0x84,
                "bool burst::subsequence_iterator<const char *>::equal(const subsequence_iterator<ForwardIterator, SubsequenceContainer> &) const [ForwardIterator = const char *, SubsequenceContainer = std::vector<const char *>]"
               );
}

Assistant:

bool equal (const subsequence_iterator & that) const
        {
            BOOST_ASSERT(this->m_begin == that.m_begin);
            BOOST_ASSERT(this->m_end == that.m_end);
            return
                std::equal
                (
                    this->subsequence_begin(), this->subsequence_end(),
                    that.subsequence_begin(), that.subsequence_end()
                );
        }